

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.cc
# Opt level: O2

Surface * __thiscall SDL2pp::Surface::SetClipRect(Surface *this,Optional<Rect> *rect)

{
  SDL_Surface *pSVar1;
  int iVar2;
  value_type *pvVar3;
  Exception *this_00;
  
  pSVar1 = this->surface_;
  if ((rect->super___optional_storage<SDL2pp::Rect,_true>).__engaged_ == true) {
    pvVar3 = sdl2pp_libcpp_optional::optional<SDL2pp::Rect>::operator*(rect);
  }
  else {
    pvVar3 = (value_type *)0x0;
  }
  iVar2 = SDL_SetClipRect(pSVar1,pvVar3);
  if (iVar2 == 1) {
    return this;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x50);
  Exception::Exception(this_00,"SDL_SetClipRect");
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

Surface& Surface::SetClipRect(const Optional<Rect>& rect) {
	if (SDL_SetClipRect(surface_, rect ? &*rect : nullptr) != SDL_TRUE)
		throw Exception("SDL_SetClipRect");
	return *this;
}